

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5SocketEnginePrivate::emitReadNotification(QSocks5SocketEnginePrivate *this)

{
  QSocks5SocketEnginePrivate *in_RDI;
  char *unaff_retaddr;
  QSocks5SocketEngine *q;
  QSocks5SocketEnginePrivate *pQVar1;
  
  pQVar1 = in_RDI;
  q_func(in_RDI);
  in_RDI->readNotificationActivated = true;
  if (((in_RDI->readNotificationEnabled & 1U) != 0) && ((in_RDI->readNotificationPending & 1U) == 0)
     ) {
    in_RDI->readNotificationPending = true;
    QMetaObject::invokeMethod<>((QObject *)q,unaff_retaddr,(ConnectionType)((ulong)pQVar1 >> 0x20));
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::emitReadNotification()
{
    Q_Q(QSocks5SocketEngine);
    readNotificationActivated = true;
    if (readNotificationEnabled && !readNotificationPending) {
        QSOCKS5_D_DEBUG << "queueing readNotification";
        readNotificationPending = true;
        QMetaObject::invokeMethod(q, "_q_emitPendingReadNotification", Qt::QueuedConnection);
    }
}